

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FragmentOutputCase::~FragmentOutputCase(FragmentOutputCase *this)

{
  ~FragmentOutputCase(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

FragmentOutputCase::~FragmentOutputCase (void)
{
	deinit();
}